

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorldImporter.cpp
# Opt level: O1

cbtStridingMeshInterfaceData * __thiscall
cbtCollisionWorldImporter::createStridingMeshInterfaceData
          (cbtCollisionWorldImporter *this,cbtStridingMeshInterfaceData *interfaceData)

{
  int iVar1;
  int iVar2;
  cbtMeshPartData *pcVar3;
  cbtStridingMeshInterfaceData **ptr;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  cbtStridingMeshInterfaceData *pcVar7;
  ulong uVar8;
  cbtMeshPartData *pcVar9;
  void *pvVar10;
  cbtStridingMeshInterfaceData **ppcVar11;
  int iVar12;
  long lVar13;
  size_t sVar14;
  size_t sVar15;
  ulong uVar16;
  long lVar17;
  bool bVar18;
  
  pcVar7 = (cbtStridingMeshInterfaceData *)::operator_new(0x20);
  uVar6 = *(undefined8 *)((interfaceData->m_scaling).m_floats + 2);
  *(undefined8 *)(pcVar7->m_scaling).m_floats = *(undefined8 *)(interfaceData->m_scaling).m_floats;
  *(undefined8 *)((pcVar7->m_scaling).m_floats + 2) = uVar6;
  uVar16 = (ulong)interfaceData->m_numMeshParts;
  pcVar7->m_numMeshParts = interfaceData->m_numMeshParts;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar16;
  uVar8 = SUB168(auVar5 * ZEXT816(0x38),0);
  if (SUB168(auVar5 * ZEXT816(0x38),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  pcVar9 = (cbtMeshPartData *)operator_new__(uVar8);
  pcVar7->m_meshPartsPtr = pcVar9;
  if (0 < (long)uVar16) {
    pcVar3 = interfaceData->m_meshPartsPtr;
    lVar13 = 0;
    do {
      iVar1 = *(int *)((long)&pcVar3->m_numTriangles + lVar13);
      lVar17 = (long)iVar1;
      *(int *)((long)&pcVar9->m_numTriangles + lVar13) = iVar1;
      iVar2 = *(int *)((long)&pcVar3->m_numVertices + lVar13);
      *(int *)((long)&pcVar9->m_numVertices + lVar13) = iVar2;
      if (*(long *)((long)&pcVar3->m_vertices3f + lVar13) == 0) {
        *(undefined8 *)((long)&pcVar9->m_vertices3f + lVar13) = 0;
      }
      else {
        sVar15 = (long)iVar2 << 4;
        sVar14 = sVar15;
        if (iVar2 < 0) {
          sVar14 = 0xffffffffffffffff;
        }
        pvVar10 = operator_new__(sVar14);
        *(void **)((long)&pcVar9->m_vertices3f + lVar13) = pvVar10;
        memcpy(pvVar10,*(void **)((long)&pcVar3->m_vertices3f + lVar13),sVar15);
      }
      if (*(long *)((long)&pcVar3->m_vertices3d + lVar13) == 0) {
        *(undefined8 *)((long)&pcVar9->m_vertices3d + lVar13) = 0;
      }
      else {
        sVar15 = (long)iVar2 << 5;
        sVar14 = sVar15;
        if (iVar2 < 0) {
          sVar14 = 0xffffffffffffffff;
        }
        pvVar10 = operator_new__(sVar14);
        *(void **)((long)&pcVar9->m_vertices3d + lVar13) = pvVar10;
        memcpy(pvVar10,*(void **)((long)&pcVar3->m_vertices3d + lVar13),sVar15);
      }
      bVar18 = *(long *)((long)&pcVar3->m_indices32 + lVar13) == 0;
      bVar4 = !bVar18;
      if (bVar18) {
        *(undefined8 *)((long)&pcVar9->m_indices32 + lVar13) = 0;
      }
      else {
        sVar14 = lVar17 * 0xc;
        if (iVar1 < 0) {
          sVar14 = 0xffffffffffffffff;
        }
        pvVar10 = operator_new__(sVar14);
        *(void **)((long)&pcVar9->m_indices32 + lVar13) = pvVar10;
        memcpy(pvVar10,*(void **)((long)&pcVar3->m_indices32 + lVar13),lVar17 * 0xc);
      }
      if (*(long *)((long)&pcVar3->m_3indices16 + lVar13) == 0) {
        *(undefined8 *)((long)&pcVar9->m_3indices16 + lVar13) = 0;
      }
      else {
        sVar14 = lVar17 * 8;
        if (iVar1 < 0) {
          sVar14 = 0xffffffffffffffff;
        }
        pvVar10 = operator_new__(sVar14);
        *(void **)((long)&pcVar9->m_3indices16 + lVar13) = pvVar10;
        memcpy(pvVar10,*(void **)((long)&pcVar3->m_3indices16 + lVar13),lVar17 * 8);
        bVar4 = true;
      }
      if (*(long *)((long)&pcVar3->m_indices16 + lVar13) == 0) {
        *(undefined8 *)((long)&pcVar9->m_indices16 + lVar13) = 0;
        if ((bVar4) || (*(long *)((long)&pcVar3->m_3indices8 + lVar13) == 0)) goto LAB_008d759d;
        sVar14 = lVar17 << 2;
        if (iVar1 < 0) {
          sVar14 = 0xffffffffffffffff;
        }
        pvVar10 = operator_new__(sVar14);
        *(void **)((long)&pcVar9->m_3indices8 + lVar13) = pvVar10;
        memcpy(pvVar10,*(void **)((long)&pcVar3->m_3indices8 + lVar13),lVar17 << 2);
      }
      else {
        sVar15 = (long)(iVar1 * 3) << 2;
        sVar14 = sVar15;
        if (iVar1 < 0) {
          sVar14 = 0xffffffffffffffff;
        }
        pvVar10 = operator_new__(sVar14);
        *(void **)((long)&pcVar9->m_indices16 + lVar13) = pvVar10;
        memcpy(pvVar10,*(void **)((long)&pcVar3->m_indices16 + lVar13),sVar15);
LAB_008d759d:
        *(undefined8 *)((long)&pcVar9->m_3indices8 + lVar13) = 0;
      }
      lVar13 = lVar13 + 0x38;
    } while (uVar16 * 0x38 != lVar13);
  }
  iVar1 = (this->m_allocatedcbtStridingMeshInterfaceDatas).m_size;
  iVar2 = (this->m_allocatedcbtStridingMeshInterfaceDatas).m_capacity;
  if (iVar1 == iVar2) {
    iVar12 = 1;
    if (iVar1 != 0) {
      iVar12 = iVar1 * 2;
    }
    if (iVar2 < iVar12) {
      if (iVar12 == 0) {
        ppcVar11 = (cbtStridingMeshInterfaceData **)0x0;
      }
      else {
        ppcVar11 = (cbtStridingMeshInterfaceData **)cbtAlignedAllocInternal((long)iVar12 << 3,0x10);
      }
      lVar13 = (long)(this->m_allocatedcbtStridingMeshInterfaceDatas).m_size;
      if (0 < lVar13) {
        lVar17 = 0;
        do {
          ppcVar11[lVar17] = (this->m_allocatedcbtStridingMeshInterfaceDatas).m_data[lVar17];
          lVar17 = lVar17 + 1;
        } while (lVar13 != lVar17);
      }
      ptr = (this->m_allocatedcbtStridingMeshInterfaceDatas).m_data;
      if (ptr != (cbtStridingMeshInterfaceData **)0x0) {
        if ((this->m_allocatedcbtStridingMeshInterfaceDatas).m_ownsMemory == true) {
          cbtAlignedFreeInternal(ptr);
        }
        (this->m_allocatedcbtStridingMeshInterfaceDatas).m_data =
             (cbtStridingMeshInterfaceData **)0x0;
      }
      (this->m_allocatedcbtStridingMeshInterfaceDatas).m_ownsMemory = true;
      (this->m_allocatedcbtStridingMeshInterfaceDatas).m_data = ppcVar11;
      (this->m_allocatedcbtStridingMeshInterfaceDatas).m_capacity = iVar12;
    }
  }
  iVar1 = (this->m_allocatedcbtStridingMeshInterfaceDatas).m_size;
  (this->m_allocatedcbtStridingMeshInterfaceDatas).m_data[iVar1] = pcVar7;
  (this->m_allocatedcbtStridingMeshInterfaceDatas).m_size = iVar1 + 1;
  return pcVar7;
}

Assistant:

cbtStridingMeshInterfaceData* cbtCollisionWorldImporter::createStridingMeshInterfaceData(cbtStridingMeshInterfaceData* interfaceData)
{
	//create a new cbtStridingMeshInterfaceData that is an exact copy of shapedata and store it in the WorldImporter
	cbtStridingMeshInterfaceData* newData = new cbtStridingMeshInterfaceData;

	newData->m_scaling = interfaceData->m_scaling;
	newData->m_numMeshParts = interfaceData->m_numMeshParts;
	newData->m_meshPartsPtr = new cbtMeshPartData[newData->m_numMeshParts];

	for (int i = 0; i < newData->m_numMeshParts; i++)
	{
		cbtMeshPartData* curPart = &interfaceData->m_meshPartsPtr[i];
		cbtMeshPartData* curNewPart = &newData->m_meshPartsPtr[i];

		curNewPart->m_numTriangles = curPart->m_numTriangles;
		curNewPart->m_numVertices = curPart->m_numVertices;

		if (curPart->m_vertices3f)
		{
			curNewPart->m_vertices3f = new cbtVector3FloatData[curNewPart->m_numVertices];
			memcpy(curNewPart->m_vertices3f, curPart->m_vertices3f, sizeof(cbtVector3FloatData) * curNewPart->m_numVertices);
		}
		else
			curNewPart->m_vertices3f = NULL;

		if (curPart->m_vertices3d)
		{
			curNewPart->m_vertices3d = new cbtVector3DoubleData[curNewPart->m_numVertices];
			memcpy(curNewPart->m_vertices3d, curPart->m_vertices3d, sizeof(cbtVector3DoubleData) * curNewPart->m_numVertices);
		}
		else
			curNewPart->m_vertices3d = NULL;

		int numIndices = curNewPart->m_numTriangles * 3;
		///the m_3indices8 was not initialized in some Bullet versions, this can cause crashes at loading time
		///we catch it by only dealing with m_3indices8 if none of the other indices are initialized
		bool uninitialized3indices8Workaround = false;

		if (curPart->m_indices32)
		{
			uninitialized3indices8Workaround = true;
			curNewPart->m_indices32 = new cbtIntIndexData[numIndices];
			memcpy(curNewPart->m_indices32, curPart->m_indices32, sizeof(cbtIntIndexData) * numIndices);
		}
		else
			curNewPart->m_indices32 = NULL;

		if (curPart->m_3indices16)
		{
			uninitialized3indices8Workaround = true;
			curNewPart->m_3indices16 = new cbtShortIntIndexTripletData[curNewPart->m_numTriangles];
			memcpy(curNewPart->m_3indices16, curPart->m_3indices16, sizeof(cbtShortIntIndexTripletData) * curNewPart->m_numTriangles);
		}
		else
			curNewPart->m_3indices16 = NULL;

		if (curPart->m_indices16)
		{
			uninitialized3indices8Workaround = true;
			curNewPart->m_indices16 = new cbtShortIntIndexData[numIndices];
			memcpy(curNewPart->m_indices16, curPart->m_indices16, sizeof(cbtShortIntIndexData) * numIndices);
		}
		else
			curNewPart->m_indices16 = NULL;

		if (!uninitialized3indices8Workaround && curPart->m_3indices8)
		{
			curNewPart->m_3indices8 = new cbtCharIndexTripletData[curNewPart->m_numTriangles];
			memcpy(curNewPart->m_3indices8, curPart->m_3indices8, sizeof(cbtCharIndexTripletData) * curNewPart->m_numTriangles);
		}
		else
			curNewPart->m_3indices8 = NULL;
	}

	m_allocatedcbtStridingMeshInterfaceDatas.push_back(newData);

	return (newData);
}